

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_number.h
# Opt level: O1

void cppcms::impl::format_traits<unsigned_long,_true>::format(unsigned_long v,char *output,size_t n)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  char buf [29];
  undefined8 uStack_40;
  byte local_38 [40];
  
  if (v == 0) {
    local_38[0] = 0x30;
    local_38[1] = 0;
  }
  else {
    pbVar4 = (byte *)((long)&uStack_40 + 7);
    do {
      pbVar3 = pbVar4;
      pbVar3[1] = (char)v + (char)(v / 10) * -10 | 0x30;
      pbVar4 = pbVar3 + 1;
      bVar2 = 9 < v;
      v = v / 10;
    } while (bVar2);
    pbVar3[2] = 0;
    if (local_38 < pbVar4) {
      pbVar3 = local_38;
      do {
        pbVar3 = pbVar3 + 1;
        bVar1 = pbVar3[-1];
        pbVar3[-1] = *pbVar4;
        *pbVar4 = bVar1;
        pbVar4 = pbVar4 + -1;
      } while (pbVar3 < pbVar4);
    }
  }
  uStack_40 = 0x23b4dc;
  strncpy(output,(char *)local_38,n - 1);
  output[n - 1] = '\0';
  return;
}

Assistant:

static void format(Value v,char *output,size_t n)
			{
				char buf[std::numeric_limits<Value>::digits10 + 10];
				char *begin = buf;
				if(v < 0) {
					*begin ++ = '-';
				}
				if(v == 0) {
					*begin ++ ='0';
					*begin = 0;
				}
				else {
					char *p=begin;
					while(v != 0) {
						int digit = v % 10;
						v/=10;
						if(digit < 0)
							*p++='0' - digit;
						else
							*p++='0' + digit;
					}
					*p-- = 0;
					while(begin < p) {
						std::swap(*begin,*p);
						begin++;
						p--;
					}
				}
				strncpy(output,buf,n-1);
				output[n-1] = 0;
			}